

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O2

uint8_t __thiscall llvm::DWARFContext::getCUAddrSize(DWARFContext *this)

{
  uint8_t uVar1;
  unit_iterator_range uVar2;
  
  uVar2 = info_section_units(this);
  if (uVar2.begin_iterator == uVar2.end_iterator) {
    uVar1 = '\0';
  }
  else {
    uVar1 = *(uint8_t *)
             ((long)&((((uVar2.begin_iterator)->_M_t).
                       super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>
                       .super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl)->Header).
                     FormParams + 2);
  }
  return uVar1;
}

Assistant:

uint8_t DWARFContext::getCUAddrSize() {
  // In theory, different compile units may have different address byte
  // sizes, but for simplicity we just use the address byte size of the
  // last compile unit. In practice the address size field is repeated across
  // various DWARF headers (at least in version 5) to make it easier to dump
  // them independently, not to enable varying the address size.
  uint8_t Addr = 0;
  for (const auto &CU : compile_units()) {
    Addr = CU->getAddressByteSize();
    break;
  }
  return Addr;
}